

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzshapequad.cpp
# Opt level: O1

void pzshape::TPZShapeQuad::Shape
               (TPZVec<double> *pt,TPZVec<long> *id,TPZVec<int> *order,TPZFMatrix<double> *phi,
               TPZFMatrix<double> *dphi)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  int iVar5;
  long *plVar6;
  int iVar7;
  long lVar8;
  ulong uVar9;
  TPZVec<double> *pt_00;
  int xj;
  long lVar10;
  int xj_1;
  uint uVar11;
  int iVar12;
  long lVar13;
  ulong uVar14;
  TPZManVector<double,_1> outvec;
  TPZFMatrix<double> phin;
  TPZFMatrix<double> dphin;
  TPZVec<long> ids;
  TPZFNMatrix<100,_double> phiblend;
  TPZFNMatrix<100,_double> dphiblend;
  REAL store1 [20];
  REAL store2 [40];
  long local_b68;
  long local_b50;
  long local_b40;
  TPZVec<double> local_b28;
  double local_b08;
  _func_int **local_b00;
  double local_af8;
  double local_af0;
  TPZFMatrix<double> local_ae8;
  TPZFMatrix<double> local_a58;
  _func_int **local_9c8;
  TPZVec<long> *local_9c0;
  TPZVec<double> *local_9b8;
  ulong local_9b0;
  TPZVec<long> local_9a8;
  TPZFMatrix<double> local_988;
  double local_8f8 [101];
  TPZFMatrix<double> local_5d0;
  double local_540 [101];
  double local_218 [20];
  double local_178 [41];
  
  local_9c0 = id;
  local_9b8 = pt;
  ShapeCorner(pt,phi,dphi);
  local_988.fElem = local_8f8;
  local_988.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow = 9;
  local_988.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol = 1;
  local_988.super_TPZMatrix<double>.super_TPZBaseMatrix.fDecomposed = '\0';
  local_988.super_TPZMatrix<double>.super_TPZBaseMatrix.fDefPositive = '\0';
  local_988.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)&PTR__TPZFMatrix_0185f360;
  local_988.fSize = 100;
  local_988.fGiven = local_988.fElem;
  TPZVec<int>::TPZVec(&local_988.fPivot.super_TPZVec<int>,0);
  local_988.fPivot.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_0183cde8;
  local_988.fPivot.super_TPZVec<int>.fStore = local_988.fPivot.fExtAlloc;
  local_988.fPivot.super_TPZVec<int>.fNElements = 0;
  local_988.fPivot.super_TPZVec<int>.fNAlloc = 0;
  local_988.fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_0183b4b0;
  local_988.fWork.fStore = (double *)0x0;
  local_988.fWork.fNElements = 0;
  local_988.fWork.fNAlloc = 0;
  local_988.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)&PTR__TPZFNMatrix_0185f070;
  local_5d0.fElem = local_540;
  local_5d0.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow = 2;
  local_5d0.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol = 9;
  local_5d0.super_TPZMatrix<double>.super_TPZBaseMatrix.fDecomposed = '\0';
  local_5d0.super_TPZMatrix<double>.super_TPZBaseMatrix.fDefPositive = '\0';
  local_5d0.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)&PTR__TPZFMatrix_0185f360;
  local_5d0.fSize = 100;
  pt_00 = (TPZVec<double> *)&local_5d0.fPivot;
  local_5d0.fGiven = local_5d0.fElem;
  TPZVec<int>::TPZVec((TPZVec<int> *)pt_00,0);
  local_5d0.fPivot.super_TPZVec<int>.fStore = local_5d0.fPivot.fExtAlloc;
  local_5d0.fPivot.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_0183cde8;
  local_5d0.fPivot.super_TPZVec<int>.fNElements = 0;
  local_5d0.fPivot.super_TPZVec<int>.fNAlloc = 0;
  local_5d0.fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_0183b4b0;
  local_5d0.fWork.fStore = (double *)0x0;
  local_5d0.fWork.fNElements = 0;
  local_5d0.fWork.fNAlloc = 0;
  local_5d0.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)&PTR__TPZFNMatrix_0185f070;
  lVar10 = 0;
  lVar8 = 0;
  do {
    if (((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow <= lVar8) ||
       ((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 1)) {
      TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    if ((local_988.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow <= lVar8) ||
       (local_988.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol < 1)) {
      TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    local_988.fElem[lVar8] = phi->fElem[lVar8];
    lVar13 = 0;
    do {
      if (((dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow <= lVar13) ||
         ((dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol <= lVar8)) {
        TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                   ,0x26d);
      }
      if ((local_5d0.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow <= lVar13) ||
         (local_5d0.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol <= lVar8)) {
        TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                   ,0x26d);
      }
      *(undefined8 *)
       ((long)local_5d0.fElem +
       lVar13 * 8 + local_5d0.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow * lVar10) =
           *(undefined8 *)
            ((long)dphi->fElem +
            lVar13 * 8 + (dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow * lVar10);
      lVar13 = lVar13 + 1;
    } while (lVar13 == 1);
    lVar8 = lVar8 + 1;
    lVar10 = lVar10 + 8;
  } while (lVar8 != 4);
  ShapeGenerating(pt_00,&local_988,&local_5d0);
  local_b68 = 4;
  local_b40 = 0x20;
  local_b00 = (_func_int **)&PTR__TPZManVector_018df490;
  local_9c8 = (_func_int **)&PTR__TPZVec_0183b5f0;
  uVar9 = 0;
  do {
    dVar1 = (double)(&gRibTrans2dQ1d)[uVar9 * 2];
    dVar2 = (double)(&DAT_01a58b78)[uVar9 * 2];
    dVar3 = local_9b8->fStore[1];
    dVar4 = *local_9b8->fStore;
    TPZVec<long>::TPZVec(&local_9a8,2);
    TPZVec<double>::TPZVec(&local_b28,0);
    local_b08 = dVar1 * dVar4 + dVar2 * dVar3;
    local_b28._vptr_TPZVec = local_b00;
    local_b28.fStore = &local_b08;
    local_b28.fNElements = 1;
    local_b28.fNAlloc = 0;
    plVar6 = local_9c0->fStore;
    *local_9a8.fStore = plVar6[uVar9];
    local_9b0 = uVar9 + 1;
    local_9a8.fStore[1] = plVar6[(uint)local_9b0 & 3];
    iVar12 = order->fStore[uVar9];
    uVar11 = iVar12 - 1;
    lVar8 = (long)(int)uVar11;
    local_ae8.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol = 1;
    local_ae8.super_TPZMatrix<double>.super_TPZBaseMatrix.fDecomposed = '\0';
    local_ae8.super_TPZMatrix<double>.super_TPZBaseMatrix.fDefPositive = '\0';
    local_ae8.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
         (_func_int **)&PTR__TPZFMatrix_0183c898;
    local_ae8.fElem = local_218;
    local_ae8.fSize = 0x14;
    local_ae8.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow = lVar8;
    local_ae8.fGiven = local_ae8.fElem;
    TPZVec<int>::TPZVec(&local_ae8.fPivot.super_TPZVec<int>,0);
    local_ae8.fPivot.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_0183cde8;
    local_ae8.fPivot.super_TPZVec<int>.fStore = local_ae8.fPivot.fExtAlloc;
    local_ae8.fPivot.super_TPZVec<int>.fNElements = 0;
    local_ae8.fPivot.super_TPZVec<int>.fNAlloc = 0;
    local_ae8.fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_0183b4b0;
    local_ae8.fWork.fStore = (double *)0x0;
    local_ae8.fWork.fNElements = 0;
    local_ae8.fWork.fNAlloc = 0;
    if (uVar11 == 0) {
      local_ae8.fElem = (double *)0x0;
    }
    else if (0x15 < iVar12) {
      local_ae8.fElem = (double *)operator_new__(lVar8 * 8);
    }
    local_a58.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow = 2;
    local_a58.super_TPZMatrix<double>.super_TPZBaseMatrix.fDecomposed = '\0';
    local_a58.super_TPZMatrix<double>.super_TPZBaseMatrix.fDefPositive = '\0';
    local_a58.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
         (_func_int **)&PTR__TPZFMatrix_0183c898;
    local_a58.fElem = local_178;
    local_a58.fSize = 0x28;
    local_a58.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol = lVar8;
    local_a58.fGiven = local_a58.fElem;
    TPZVec<int>::TPZVec(&local_a58.fPivot.super_TPZVec<int>,0);
    local_a58.fPivot.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_0183cde8;
    local_a58.fPivot.super_TPZVec<int>.fStore = local_a58.fPivot.fExtAlloc;
    local_a58.fPivot.super_TPZVec<int>.fNElements = 0;
    local_a58.fPivot.super_TPZVec<int>.fNAlloc = 0;
    local_a58.fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_0183b4b0;
    local_a58.fWork.fStore = (double *)0x0;
    local_a58.fWork.fNElements = 0;
    local_a58.fWork.fNAlloc = 0;
    if (uVar11 == 0) {
      local_a58.fElem = (double *)0x0;
    }
    else if (0x15 < iVar12) {
      local_a58.fElem = (double *)operator_new__(lVar8 << 4);
    }
    iVar5 = order->fStore[uVar9];
    iVar7 = TPZShapeLinear::GetTransformId1d(&local_9a8);
    TPZShapeLinear::ShapeInternal(&local_b28,iVar5,&local_ae8,&local_a58,iVar7);
    TransformDerivativeFromRibToQuad((int)uVar9,uVar11,&local_a58);
    if (1 < iVar12) {
      uVar9 = uVar9 | 4;
      local_b68 = (long)(int)local_b68;
      lVar8 = local_b68 * 8;
      lVar10 = 0;
      uVar14 = 0;
      do {
        if ((local_988.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow <= (long)uVar9) ||
           (local_988.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol < 1)) {
          TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
          pzinternal::DebugStopImpl
                    ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                     ,0x26d);
        }
        if ((local_ae8.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow <= (long)uVar14) ||
           (local_ae8.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol < 1)) {
          TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
          pzinternal::DebugStopImpl
                    ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                     ,0x26d);
        }
        if (((local_b68 < 0) ||
            ((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow <= local_b68)) ||
           ((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 1)) {
          TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
          pzinternal::DebugStopImpl
                    ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                     ,0x26d);
        }
        phi->fElem[local_b68] = local_988.fElem[uVar9] * local_ae8.fElem[uVar14];
        lVar13 = 0;
        do {
          if ((local_5d0.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow <= lVar13) ||
             (local_5d0.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol <= (long)uVar9)) {
            TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
            pzinternal::DebugStopImpl
                      ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                       ,0x26d);
          }
          if ((local_ae8.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow <= (long)uVar14) ||
             (local_ae8.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol < 1)) {
            TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
            pzinternal::DebugStopImpl
                      ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                       ,0x26d);
          }
          if ((local_988.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow <= (long)uVar9) ||
             (local_988.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol < 1)) {
            TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
            pzinternal::DebugStopImpl
                      ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                       ,0x26d);
          }
          local_af0 = local_988.fElem[uVar9];
          if ((local_a58.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow <= lVar13) ||
             (local_a58.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol <= (long)uVar14)) {
            TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
            pzinternal::DebugStopImpl
                      ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                       ,0x26d);
          }
          local_af8 = *(double *)
                       ((long)local_a58.fElem +
                       lVar13 * 8 +
                       local_a58.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow * lVar10);
          if ((((dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow <= lVar13) ||
              (local_b68 < 0)) ||
             ((dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol <= local_b68)) {
            TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
            pzinternal::DebugStopImpl
                      ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                       ,0x26d);
          }
          *(double *)
           ((long)dphi->fElem +
           lVar13 * 8 + (dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow * lVar8) =
               *(double *)
                ((long)local_5d0.fElem +
                lVar13 * 8 + local_5d0.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow * local_b40)
               * local_ae8.fElem[uVar14] + local_af0 * local_af8;
          lVar13 = lVar13 + 1;
        } while (lVar13 == 1);
        local_b68 = local_b68 + 1;
        uVar14 = uVar14 + 1;
        lVar10 = lVar10 + 8;
        lVar8 = lVar8 + 8;
      } while (uVar14 != uVar11);
    }
    TPZFMatrix<double>::~TPZFMatrix(&local_a58);
    TPZFMatrix<double>::~TPZFMatrix(&local_ae8);
    if (local_b28.fStore == &local_b08) {
      local_b28.fStore = (double *)0x0;
    }
    local_b28.fNAlloc = 0;
    local_b28._vptr_TPZVec = (_func_int **)&PTR__TPZVec_0183b4b0;
    if (local_b28.fStore != (double *)0x0) {
      operator_delete__(local_b28.fStore);
    }
    local_9a8._vptr_TPZVec = local_9c8;
    if (local_9a8.fStore != (long *)0x0) {
      operator_delete__(local_9a8.fStore);
    }
    local_b40 = local_b40 + 8;
    uVar9 = local_9b0;
  } while (local_9b0 != 4);
  iVar12 = order->fStore[4] + -1;
  uVar11 = iVar12 * iVar12;
  uVar9 = (ulong)uVar11;
  local_ae8.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol = 1;
  local_ae8.super_TPZMatrix<double>.super_TPZBaseMatrix.fDecomposed = '\0';
  local_ae8.super_TPZMatrix<double>.super_TPZBaseMatrix.fDefPositive = '\0';
  local_ae8.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)&PTR__TPZFMatrix_0183c898;
  local_ae8.fElem = local_218;
  local_ae8.fSize = 0x14;
  local_ae8.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow = uVar9;
  local_ae8.fGiven = local_ae8.fElem;
  TPZVec<int>::TPZVec(&local_ae8.fPivot.super_TPZVec<int>,0);
  local_ae8.fPivot.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_0183cde8;
  local_ae8.fPivot.super_TPZVec<int>.fStore = local_ae8.fPivot.fExtAlloc;
  local_ae8.fPivot.super_TPZVec<int>.fNElements = 0;
  local_ae8.fPivot.super_TPZVec<int>.fNAlloc = 0;
  local_ae8.fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_0183b4b0;
  local_ae8.fWork.fStore = (double *)0x0;
  local_ae8.fWork.fNElements = 0;
  local_ae8.fWork.fNAlloc = 0;
  if (iVar12 == 0) {
    local_ae8.fElem = (double *)0x0;
  }
  else if (0x14 < uVar11) {
    local_ae8.fElem = (double *)operator_new__(uVar9 * 8);
  }
  local_a58.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow = 2;
  local_a58.super_TPZMatrix<double>.super_TPZBaseMatrix.fDecomposed = '\0';
  local_a58.super_TPZMatrix<double>.super_TPZBaseMatrix.fDefPositive = '\0';
  local_a58.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)&PTR__TPZFMatrix_0183c898;
  local_a58.fElem = local_178;
  local_a58.fSize = 0x28;
  local_a58.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol = uVar9;
  local_a58.fGiven = local_a58.fElem;
  TPZVec<int>::TPZVec(&local_a58.fPivot.super_TPZVec<int>,0);
  local_a58.fPivot.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_0183cde8;
  local_a58.fPivot.super_TPZVec<int>.fStore = local_a58.fPivot.fExtAlloc;
  local_a58.fPivot.super_TPZVec<int>.fNElements = 0;
  local_a58.fPivot.super_TPZVec<int>.fNAlloc = 0;
  local_a58.fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_0183b4b0;
  local_a58.fWork.fStore = (double *)0x0;
  local_a58.fWork.fNElements = 0;
  local_a58.fWork.fNAlloc = 0;
  if (iVar12 == 0) {
    local_a58.fElem = (double *)0x0;
  }
  else if (0x14 < uVar11) {
    local_a58.fElem = (double *)operator_new__(uVar9 << 4);
  }
  iVar5 = order->fStore[4];
  iVar7 = GetTransformId2dQ(local_9c0);
  ShapeInternal(local_9b8,iVar5 + -2,&local_ae8,&local_a58,iVar7);
  if (iVar12 != 0) {
    local_b50 = (long)(int)local_b68;
    uVar9 = 1;
    if (1 < uVar11) {
      uVar9 = (ulong)uVar11;
    }
    local_b68 = local_b50 * 8;
    local_b40 = 0;
    uVar14 = 0;
    do {
      if ((local_988.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow < 9) ||
         (local_988.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol < 1)) {
        TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                   ,0x26d);
      }
      if ((local_ae8.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow <= (long)uVar14) ||
         (local_ae8.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol < 1)) {
        TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                   ,0x26d);
      }
      if (((local_b50 < 0) || ((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow <= local_b50)
          ) || ((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 1)) {
        TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                   ,0x26d);
      }
      phi->fElem[local_b50] = local_988.fElem[8] * local_ae8.fElem[uVar14];
      lVar8 = 0;
      do {
        if ((local_5d0.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow <= lVar8) ||
           (local_5d0.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol < 9)) {
          TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
          pzinternal::DebugStopImpl
                    ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                     ,0x26d);
        }
        if ((local_ae8.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow <= (long)uVar14) ||
           (local_ae8.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol < 1)) {
          TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
          pzinternal::DebugStopImpl
                    ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                     ,0x26d);
        }
        if ((local_988.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow < 9) ||
           (local_988.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol < 1)) {
          TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
          pzinternal::DebugStopImpl
                    ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                     ,0x26d);
        }
        local_af0 = local_988.fElem[8];
        if ((local_a58.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow <= lVar8) ||
           (local_a58.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol <= (long)uVar14)) {
          TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
          pzinternal::DebugStopImpl
                    ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                     ,0x26d);
        }
        local_af8 = *(double *)
                     ((long)local_a58.fElem +
                     lVar8 * 8 +
                     local_a58.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow * local_b40);
        if ((((dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow <= lVar8) || (local_b50 < 0))
           || ((dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol <= local_b50)) {
          TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
          pzinternal::DebugStopImpl
                    ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                     ,0x26d);
        }
        *(double *)
         ((long)dphi->fElem +
         lVar8 * 8 + (dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow * local_b68) =
             local_5d0.fElem[local_5d0.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow * 8 + lVar8]
             * local_ae8.fElem[uVar14] + local_af0 * local_af8;
        lVar8 = lVar8 + 1;
      } while (lVar8 == 1);
      local_b50 = local_b50 + 1;
      uVar14 = uVar14 + 1;
      local_b40 = local_b40 + 8;
      local_b68 = local_b68 + 8;
    } while (uVar14 != uVar9);
  }
  TPZFMatrix<double>::~TPZFMatrix(&local_a58);
  TPZFMatrix<double>::~TPZFMatrix(&local_ae8);
  TPZFMatrix<double>::~TPZFMatrix(&local_5d0,&PTR_PTR_0185f328);
  TPZFMatrix<double>::~TPZFMatrix(&local_988,&PTR_PTR_0185f328);
  return;
}

Assistant:

void TPZShapeQuad::Shape(TPZVec<REAL> &pt, TPZVec<int64_t> &id, TPZVec<int> &order,
                             TPZFMatrix<REAL> &phi,TPZFMatrix<REAL> &dphi) {
        ShapeCorner(pt,phi,dphi);
        int is,d;
        TPZFNMatrix<100> phiblend(NSides,1),dphiblend(Dimension,NSides);
        for(is=0; is<NCornerNodes; is++)
        {
            phiblend(is,0) = phi(is,0);
            for(d=0; d<Dimension; d++)
            {
                dphiblend(d,is) = dphi(d,is);
            }
        }
        ShapeGenerating(pt,phiblend,dphiblend);
        REAL out;
        int shape = 4;
        for (int rib = 0; rib < 4; rib++) {
            
            ProjectPoint2dQuadToRib(rib,pt,out);
            TPZVec<int64_t> ids(2);
            TPZManVector<REAL,1> outvec(1,out);
            ids[0] = id[rib%4];
            ids[1] = id[(rib+1)%4];
            REAL store1[20],store2[40];
            int ord2 = order[rib]-1;//two orders : order in x and order in y
            TPZFMatrix<REAL> phin(ord2,1,store1,20),dphin(2,ord2,store2,40);
            TPZShapeLinear::ShapeInternal(outvec,order[rib],phin,dphin,TPZShapeLinear::GetTransformId1d(ids));
            TransformDerivativeFromRibToQuad(rib,ord2,dphin);
            for (int i = 0; i < ord2; i++) {
                phi(shape,0) = phiblend(rib+4,0)*phin(i,0);
                for(int xj=0;xj<2;xj++) {
                    dphi(xj,shape) = dphiblend(xj,rib+4)*phin(i,0)+
                    phiblend(rib+4,0)*dphin(xj,i);
                }
                shape++;
            }
        }
        REAL store1[20],store2[40];
        int ord = (order[4]-1)*(order[4]-1);
        TPZFMatrix<REAL> phin(ord,1,store1,20),dphin(2,ord,store2,40);
        ShapeInternal(pt,order[4]-2,phin,dphin,GetTransformId2dQ(id));
        for(int i=0;i<ord;i++)    {//funcoes de interior s�o em numero ordem-1
            phi(shape,0) = phiblend(8,0)*phin(i,0);
            for(int xj=0;xj<2;xj++) {//x e y
                dphi(xj,shape) = dphiblend(xj,8)*phin(i,0) +
                phiblend(8,0)*dphin(xj,i);
            }
            shape++;
        }
    }